

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.cpp
# Opt level: O2

bool __thiscall CMessageHeader::IsCommandValid(CMessageHeader *this)

{
  uchar *puVar1;
  uchar uVar2;
  long lVar3;
  long lVar5;
  long in_FS_OFFSET;
  long lVar4;
  
  lVar3 = 4;
  while (lVar3 < 0x10) {
    uVar2 = (this->pchMessageStart)._M_elems[lVar3];
    lVar5 = lVar3;
    if (uVar2 == '\0') {
      while (lVar4 = 0x10, lVar5 != 0x10) {
        puVar1 = (this->pchMessageStart)._M_elems + lVar5;
        lVar5 = lVar5 + 1;
        if (*puVar1 != '\0') goto LAB_00a9fd7e;
      }
    }
    else {
      lVar4 = lVar3;
      if ((byte)(uVar2 + 0x81) < 0xa1) break;
    }
    lVar3 = lVar4 + 1;
  }
LAB_00a9fd7e:
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
    __stack_chk_fail();
  }
  return 0xf < lVar3;
}

Assistant:

bool CMessageHeader::IsCommandValid() const
{
    // Check the command string for errors
    for (const char* p1 = pchCommand; p1 < pchCommand + COMMAND_SIZE; ++p1) {
        if (*p1 == 0) {
            // Must be all zeros after the first zero
            for (; p1 < pchCommand + COMMAND_SIZE; ++p1) {
                if (*p1 != 0) {
                    return false;
                }
            }
        } else if (*p1 < ' ' || *p1 > 0x7E) {
            return false;
        }
    }

    return true;
}